

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscExpressions.cpp
# Opt level: O2

Expression *
slang::ast::CopyClassExpression::fromSyntax
          (Compilation *compilation,CopyClassExpressionSyntax *syntax,ASTContext *context)

{
  not_null<const_slang::ast::Type_*> *this;
  bool bVar1;
  ExpressionSyntax *syntax_00;
  Expression *pEVar2;
  Type *pTVar3;
  CopyClassExpression *expr;
  Diagnostic *diag;
  SourceRange local_40;
  
  syntax_00 = not_null<slang::syntax::ExpressionSyntax_*>::get(&syntax->expr);
  pEVar2 = Expression::selfDetermined
                     (compilation,syntax_00,context,(bitmask<slang::ast::ASTFlags>)0x0);
  this = &pEVar2->type;
  pTVar3 = not_null<const_slang::ast::Type_*>::get(this);
  local_40 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
  expr = BumpAllocator::
         emplace<slang::ast::CopyClassExpression,slang::ast::Type_const&,slang::ast::Expression&,slang::SourceRange>
                   (&compilation->super_BumpAllocator,pTVar3,pEVar2,&local_40);
  bVar1 = Expression::bad(pEVar2);
  if (!bVar1) {
    pTVar3 = not_null<const_slang::ast::Type_*>::get(this);
    bVar1 = Type::isClass(pTVar3);
    if (bVar1) {
      return &expr->super_Expression;
    }
    diag = ASTContext::addDiag(context,(DiagCode)0x3c0007,pEVar2->sourceRange);
    pTVar3 = not_null<const_slang::ast::Type_*>::get(this);
    ast::operator<<(diag,pTVar3);
  }
  pEVar2 = Expression::badExpr(compilation,&expr->super_Expression);
  return pEVar2;
}

Assistant:

Expression& CopyClassExpression::fromSyntax(Compilation& compilation,
                                            const CopyClassExpressionSyntax& syntax,
                                            const ASTContext& context) {
    auto& source = selfDetermined(compilation, *syntax.expr, context);
    auto result = compilation.emplace<CopyClassExpression>(*source.type, source,
                                                           syntax.sourceRange());
    if (source.bad())
        return badExpr(compilation, result);

    if (!source.type->isClass()) {
        context.addDiag(diag::CopyClassTarget, source.sourceRange) << *source.type;
        return badExpr(compilation, result);
    }

    return *result;
}